

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8_fp16.h
# Opt level: O1

void ncnn::conv2x2s1_fp16_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  uint uVar20;
  int iVar21;
  undefined1 (*pauVar22) [32];
  undefined1 (*pauVar23) [32];
  undefined1 (*pauVar24) [16];
  long lVar25;
  undefined4 *puVar26;
  undefined4 *puVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  ulong local_208;
  undefined1 local_78 [32];
  
  iVar3 = top_blob->c;
  if (0 < (long)iVar3) {
    uVar4 = bottom_blob->c;
    uVar5 = top_blob->w;
    iVar6 = top_blob->h;
    pvVar7 = _bias->data;
    lVar25 = 0;
    do {
      iVar19 = 1;
      if (top_blob->dims != 3) {
        iVar19 = top_blob->d;
      }
      if (pvVar7 == (void *)0x0) {
        auVar28 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        auVar28 = *(undefined1 (*) [32])((long)pvVar7 + lVar25 * 0x20);
      }
      pauVar23 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar25 * top_blob->elemsize + (long)top_blob->data);
      iVar19 = iVar19 * top_blob->h * top_blob->w;
      pauVar22 = pauVar23;
      if (0 < iVar19) {
        do {
          *pauVar22 = auVar28;
          iVar19 = iVar19 + -1;
          pauVar22 = pauVar22 + 1;
        } while (iVar19 != 0);
      }
      if (0 < (int)uVar4) {
        local_208 = 0;
        do {
          if (0 < iVar6) {
            pauVar24 = (undefined1 (*) [16])
                       ((long)kernel->data +
                       kernel->elemsize * local_208 * (long)kernel->w +
                       kernel->cstep * lVar25 * kernel->elemsize);
            puVar26 = (undefined4 *)
                      (bottom_blob->cstep * local_208 * bottom_blob->elemsize +
                      (long)bottom_blob->data);
            puVar27 = (undefined4 *)((long)bottom_blob->w * bottom_blob->elemsize + (long)puVar26);
            iVar19 = 0;
            pauVar22 = pauVar23;
            do {
              if ((int)uVar5 < 2) {
                uVar20 = 0;
              }
              else {
                iVar21 = 1;
                do {
                  uVar1 = *puVar26;
                  auVar29._4_4_ = uVar1;
                  auVar29._0_4_ = uVar1;
                  auVar29._8_4_ = uVar1;
                  auVar29._12_4_ = uVar1;
                  auVar29._16_4_ = uVar1;
                  auVar29._20_4_ = uVar1;
                  auVar29._24_4_ = uVar1;
                  auVar29._28_4_ = uVar1;
                  uVar1 = puVar26[1];
                  auVar61._4_4_ = uVar1;
                  auVar61._0_4_ = uVar1;
                  auVar61._8_4_ = uVar1;
                  auVar61._12_4_ = uVar1;
                  auVar61._16_4_ = uVar1;
                  auVar61._20_4_ = uVar1;
                  auVar61._24_4_ = uVar1;
                  auVar61._28_4_ = uVar1;
                  uVar1 = puVar26[2];
                  auVar54._4_4_ = uVar1;
                  auVar54._0_4_ = uVar1;
                  auVar54._8_4_ = uVar1;
                  auVar54._12_4_ = uVar1;
                  auVar54._16_4_ = uVar1;
                  auVar54._20_4_ = uVar1;
                  auVar54._24_4_ = uVar1;
                  auVar54._28_4_ = uVar1;
                  uVar1 = puVar26[3];
                  auVar51._4_4_ = uVar1;
                  auVar51._0_4_ = uVar1;
                  auVar51._8_4_ = uVar1;
                  auVar51._12_4_ = uVar1;
                  auVar51._16_4_ = uVar1;
                  auVar51._20_4_ = uVar1;
                  auVar51._24_4_ = uVar1;
                  auVar51._28_4_ = uVar1;
                  uVar1 = puVar26[4];
                  auVar92._4_4_ = uVar1;
                  auVar92._0_4_ = uVar1;
                  auVar92._8_4_ = uVar1;
                  auVar92._12_4_ = uVar1;
                  auVar92._16_4_ = uVar1;
                  auVar92._20_4_ = uVar1;
                  auVar92._24_4_ = uVar1;
                  auVar92._28_4_ = uVar1;
                  uVar1 = puVar26[5];
                  auVar82._4_4_ = uVar1;
                  auVar82._0_4_ = uVar1;
                  auVar82._8_4_ = uVar1;
                  auVar82._12_4_ = uVar1;
                  auVar82._16_4_ = uVar1;
                  auVar82._20_4_ = uVar1;
                  auVar82._24_4_ = uVar1;
                  auVar82._28_4_ = uVar1;
                  uVar1 = puVar26[6];
                  local_78._4_4_ = puVar26[7];
                  local_78._0_4_ = local_78._4_4_;
                  local_78._8_4_ = local_78._4_4_;
                  local_78._12_4_ = local_78._4_4_;
                  local_78._16_4_ = local_78._4_4_;
                  local_78._20_4_ = local_78._4_4_;
                  local_78._24_4_ = local_78._4_4_;
                  local_78._28_4_ = local_78._4_4_;
                  auVar8 = vlddqu_avx(*pauVar24);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[1]);
                  auVar30 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[2]);
                  auVar33 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[3]);
                  auVar12 = vcvtph2ps_f16c(auVar8);
                  auVar13 = vfmadd213ps_fma(auVar29,auVar28,*pauVar22);
                  auVar8 = vlddqu_avx(pauVar24[4]);
                  auVar9 = vlddqu_avx(pauVar24[5]);
                  auVar10 = vlddqu_avx(pauVar24[6]);
                  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar30,auVar61);
                  auVar13 = vlddqu_avx(pauVar24[7]);
                  uVar2 = puVar26[8];
                  auVar88._4_4_ = uVar2;
                  auVar88._0_4_ = uVar2;
                  auVar88._8_4_ = uVar2;
                  auVar88._12_4_ = uVar2;
                  auVar88._16_4_ = uVar2;
                  auVar88._20_4_ = uVar2;
                  auVar88._24_4_ = uVar2;
                  auVar88._28_4_ = uVar2;
                  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar33,auVar54);
                  auVar29 = vcvtph2ps_f16c(auVar8);
                  uVar2 = puVar26[9];
                  auVar62._4_4_ = uVar2;
                  auVar62._0_4_ = uVar2;
                  auVar62._8_4_ = uVar2;
                  auVar62._12_4_ = uVar2;
                  auVar62._16_4_ = uVar2;
                  auVar62._20_4_ = uVar2;
                  auVar62._24_4_ = uVar2;
                  auVar62._28_4_ = uVar2;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar12,auVar51);
                  uVar2 = puVar26[10];
                  auVar47._4_4_ = uVar2;
                  auVar47._0_4_ = uVar2;
                  auVar47._8_4_ = uVar2;
                  auVar47._12_4_ = uVar2;
                  auVar47._16_4_ = uVar2;
                  auVar47._20_4_ = uVar2;
                  auVar47._24_4_ = uVar2;
                  auVar47._28_4_ = uVar2;
                  uVar2 = puVar26[0xb];
                  auVar99._4_4_ = uVar2;
                  auVar99._0_4_ = uVar2;
                  auVar99._8_4_ = uVar2;
                  auVar99._12_4_ = uVar2;
                  auVar99._16_4_ = uVar2;
                  auVar99._20_4_ = uVar2;
                  auVar99._24_4_ = uVar2;
                  auVar99._28_4_ = uVar2;
                  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar29,auVar92);
                  auVar8 = vfmadd213ps_fma(auVar28,auVar88,pauVar22[1]);
                  auVar28 = vcvtph2ps_f16c(auVar9);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar62,auVar30);
                  uVar2 = puVar26[0xc];
                  auVar69._4_4_ = uVar2;
                  auVar69._0_4_ = uVar2;
                  auVar69._8_4_ = uVar2;
                  auVar69._12_4_ = uVar2;
                  auVar69._16_4_ = uVar2;
                  auVar69._20_4_ = uVar2;
                  auVar69._24_4_ = uVar2;
                  auVar69._28_4_ = uVar2;
                  auVar30 = vcvtph2ps_f16c(auVar10);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar47,auVar33);
                  uVar2 = puVar26[0xd];
                  auVar76._4_4_ = uVar2;
                  auVar76._0_4_ = uVar2;
                  auVar76._8_4_ = uVar2;
                  auVar76._12_4_ = uVar2;
                  auVar76._16_4_ = uVar2;
                  auVar76._20_4_ = uVar2;
                  auVar76._24_4_ = uVar2;
                  auVar76._28_4_ = uVar2;
                  auVar33 = vcvtph2ps_f16c(auVar13);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar99,auVar12);
                  uVar2 = puVar26[0xe];
                  auVar57._4_4_ = uVar2;
                  auVar57._0_4_ = uVar2;
                  auVar57._8_4_ = uVar2;
                  auVar57._12_4_ = uVar2;
                  auVar57._16_4_ = uVar2;
                  auVar57._20_4_ = uVar2;
                  auVar57._24_4_ = uVar2;
                  auVar57._28_4_ = uVar2;
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar82);
                  uVar2 = puVar26[0xf];
                  auVar93._4_4_ = uVar2;
                  auVar93._0_4_ = uVar2;
                  auVar93._8_4_ = uVar2;
                  auVar93._12_4_ = uVar2;
                  auVar93._16_4_ = uVar2;
                  auVar93._20_4_ = uVar2;
                  auVar93._24_4_ = uVar2;
                  auVar93._28_4_ = uVar2;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar69,auVar29);
                  auVar12._4_4_ = uVar1;
                  auVar12._0_4_ = uVar1;
                  auVar12._8_4_ = uVar1;
                  auVar12._12_4_ = uVar1;
                  auVar12._16_4_ = uVar1;
                  auVar12._20_4_ = uVar1;
                  auVar12._24_4_ = uVar1;
                  auVar12._28_4_ = uVar1;
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar30,auVar12);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar76,auVar28);
                  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar57,auVar30);
                  auVar8 = vlddqu_avx(pauVar24[8]);
                  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar33,local_78);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[9]);
                  auVar9 = vlddqu_avx(pauVar24[10]);
                  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar93,auVar33);
                  auVar10 = vlddqu_avx(pauVar24[0xb]);
                  auVar13 = vlddqu_avx(pauVar24[0xc]);
                  auVar14 = vlddqu_avx(pauVar24[0xd]);
                  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar28,auVar88);
                  auVar15 = vlddqu_avx(pauVar24[0xe]);
                  auVar11 = vlddqu_avx(pauVar24[0xf]);
                  uVar1 = puVar26[0x10];
                  auVar33._4_4_ = uVar1;
                  auVar33._0_4_ = uVar1;
                  auVar33._8_4_ = uVar1;
                  auVar33._12_4_ = uVar1;
                  auVar33._16_4_ = uVar1;
                  auVar33._20_4_ = uVar1;
                  auVar33._24_4_ = uVar1;
                  auVar33._28_4_ = uVar1;
                  auVar16 = vfmadd213ps_fma(auVar33,auVar28,ZEXT1632(auVar16));
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  uVar1 = puVar26[0x11];
                  auVar100._4_4_ = uVar1;
                  auVar100._0_4_ = uVar1;
                  auVar100._8_4_ = uVar1;
                  auVar100._12_4_ = uVar1;
                  auVar100._16_4_ = uVar1;
                  auVar100._20_4_ = uVar1;
                  auVar100._24_4_ = uVar1;
                  auVar100._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar28,auVar62);
                  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar28,auVar100);
                  uVar1 = puVar26[0x12];
                  auVar43._4_4_ = uVar1;
                  auVar43._0_4_ = uVar1;
                  auVar43._8_4_ = uVar1;
                  auVar43._12_4_ = uVar1;
                  auVar43._16_4_ = uVar1;
                  auVar43._20_4_ = uVar1;
                  auVar43._24_4_ = uVar1;
                  auVar43._28_4_ = uVar1;
                  auVar28 = vcvtph2ps_f16c(auVar9);
                  uVar1 = puVar26[0x13];
                  auVar96._4_4_ = uVar1;
                  auVar96._0_4_ = uVar1;
                  auVar96._8_4_ = uVar1;
                  auVar96._12_4_ = uVar1;
                  auVar96._16_4_ = uVar1;
                  auVar96._20_4_ = uVar1;
                  auVar96._24_4_ = uVar1;
                  auVar96._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar28,auVar47);
                  uVar1 = puVar26[0x14];
                  auVar101._4_4_ = uVar1;
                  auVar101._0_4_ = uVar1;
                  auVar101._8_4_ = uVar1;
                  auVar101._12_4_ = uVar1;
                  auVar101._16_4_ = uVar1;
                  auVar101._20_4_ = uVar1;
                  auVar101._24_4_ = uVar1;
                  auVar101._28_4_ = uVar1;
                  auVar30 = vcvtph2ps_f16c(auVar10);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar30,auVar99);
                  uVar1 = puVar26[0x15];
                  auVar103._4_4_ = uVar1;
                  auVar103._0_4_ = uVar1;
                  auVar103._8_4_ = uVar1;
                  auVar103._12_4_ = uVar1;
                  auVar103._16_4_ = uVar1;
                  auVar103._20_4_ = uVar1;
                  auVar103._24_4_ = uVar1;
                  auVar103._28_4_ = uVar1;
                  auVar33 = vcvtph2ps_f16c(auVar13);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar33,auVar69);
                  uVar1 = puVar26[0x16];
                  auVar70._4_4_ = uVar1;
                  auVar70._0_4_ = uVar1;
                  auVar70._8_4_ = uVar1;
                  auVar70._12_4_ = uVar1;
                  auVar70._16_4_ = uVar1;
                  auVar70._20_4_ = uVar1;
                  auVar70._24_4_ = uVar1;
                  auVar70._28_4_ = uVar1;
                  auVar12 = vcvtph2ps_f16c(auVar14);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar12,auVar76);
                  uVar1 = puVar26[0x17];
                  auVar77._4_4_ = uVar1;
                  auVar77._0_4_ = uVar1;
                  auVar77._8_4_ = uVar1;
                  auVar77._12_4_ = uVar1;
                  auVar77._16_4_ = uVar1;
                  auVar77._20_4_ = uVar1;
                  auVar77._24_4_ = uVar1;
                  auVar77._28_4_ = uVar1;
                  auVar29 = vcvtph2ps_f16c(auVar15);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar28,auVar43);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar30,auVar96);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar33,auVar101);
                  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar29,auVar57);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar12,auVar103);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar29,auVar70);
                  uVar1 = *puVar27;
                  auVar44._4_4_ = uVar1;
                  auVar44._0_4_ = uVar1;
                  auVar44._8_4_ = uVar1;
                  auVar44._12_4_ = uVar1;
                  auVar44._16_4_ = uVar1;
                  auVar44._20_4_ = uVar1;
                  auVar44._24_4_ = uVar1;
                  auVar44._28_4_ = uVar1;
                  uVar1 = puVar27[1];
                  auVar83._4_4_ = uVar1;
                  auVar83._0_4_ = uVar1;
                  auVar83._8_4_ = uVar1;
                  auVar83._12_4_ = uVar1;
                  auVar83._16_4_ = uVar1;
                  auVar83._20_4_ = uVar1;
                  auVar83._24_4_ = uVar1;
                  auVar83._28_4_ = uVar1;
                  uVar1 = puVar27[2];
                  auVar104._4_4_ = uVar1;
                  auVar104._0_4_ = uVar1;
                  auVar104._8_4_ = uVar1;
                  auVar104._12_4_ = uVar1;
                  auVar104._16_4_ = uVar1;
                  auVar104._20_4_ = uVar1;
                  auVar104._24_4_ = uVar1;
                  auVar104._28_4_ = uVar1;
                  uVar1 = puVar27[3];
                  auVar71._4_4_ = uVar1;
                  auVar71._0_4_ = uVar1;
                  auVar71._8_4_ = uVar1;
                  auVar71._12_4_ = uVar1;
                  auVar71._16_4_ = uVar1;
                  auVar71._20_4_ = uVar1;
                  auVar71._24_4_ = uVar1;
                  auVar71._28_4_ = uVar1;
                  uVar1 = puVar27[4];
                  auVar63._4_4_ = uVar1;
                  auVar63._0_4_ = uVar1;
                  auVar63._8_4_ = uVar1;
                  auVar63._12_4_ = uVar1;
                  auVar63._16_4_ = uVar1;
                  auVar63._20_4_ = uVar1;
                  auVar63._24_4_ = uVar1;
                  auVar63._28_4_ = uVar1;
                  uVar1 = puVar27[5];
                  auVar97._4_4_ = uVar1;
                  auVar97._0_4_ = uVar1;
                  auVar97._8_4_ = uVar1;
                  auVar97._12_4_ = uVar1;
                  auVar97._16_4_ = uVar1;
                  auVar97._20_4_ = uVar1;
                  auVar97._24_4_ = uVar1;
                  auVar97._28_4_ = uVar1;
                  uVar1 = puVar27[6];
                  auVar102._4_4_ = uVar1;
                  auVar102._0_4_ = uVar1;
                  auVar102._8_4_ = uVar1;
                  auVar102._12_4_ = uVar1;
                  auVar102._16_4_ = uVar1;
                  auVar102._20_4_ = uVar1;
                  auVar102._24_4_ = uVar1;
                  auVar102._28_4_ = uVar1;
                  uVar1 = puVar27[7];
                  auVar8 = vlddqu_avx(pauVar24[0x10]);
                  auVar28 = vcvtph2ps_f16c(auVar11);
                  auVar30 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[0x11]);
                  auVar33 = vcvtph2ps_f16c(auVar8);
                  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar28,auVar93);
                  auVar8 = vlddqu_avx(pauVar24[0x12]);
                  auVar12 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[0x13]);
                  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar28,auVar77);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar44,auVar30,ZEXT1632(auVar10));
                  auVar8 = vlddqu_avx(pauVar24[0x14]);
                  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar33,auVar83);
                  auVar29 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[0x15]);
                  auVar9 = vlddqu_avx(pauVar24[0x16]);
                  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar12,auVar104);
                  auVar10 = vlddqu_avx(pauVar24[0x17]);
                  uVar2 = puVar27[8];
                  auVar78._4_4_ = uVar2;
                  auVar78._0_4_ = uVar2;
                  auVar78._8_4_ = uVar2;
                  auVar78._12_4_ = uVar2;
                  auVar78._16_4_ = uVar2;
                  auVar78._20_4_ = uVar2;
                  auVar78._24_4_ = uVar2;
                  auVar78._28_4_ = uVar2;
                  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar28,auVar71);
                  auVar34 = vcvtph2ps_f16c(auVar8);
                  uVar2 = puVar27[9];
                  auVar72._4_4_ = uVar2;
                  auVar72._0_4_ = uVar2;
                  auVar72._8_4_ = uVar2;
                  auVar72._12_4_ = uVar2;
                  auVar72._16_4_ = uVar2;
                  auVar72._20_4_ = uVar2;
                  auVar72._24_4_ = uVar2;
                  auVar72._28_4_ = uVar2;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar29,auVar63);
                  uVar2 = puVar27[10];
                  auVar64._4_4_ = uVar2;
                  auVar64._0_4_ = uVar2;
                  auVar64._8_4_ = uVar2;
                  auVar64._12_4_ = uVar2;
                  auVar64._16_4_ = uVar2;
                  auVar64._20_4_ = uVar2;
                  auVar64._24_4_ = uVar2;
                  auVar64._28_4_ = uVar2;
                  uVar2 = puVar27[0xb];
                  auVar84._4_4_ = uVar2;
                  auVar84._0_4_ = uVar2;
                  auVar84._8_4_ = uVar2;
                  auVar84._12_4_ = uVar2;
                  auVar84._16_4_ = uVar2;
                  auVar84._20_4_ = uVar2;
                  auVar84._24_4_ = uVar2;
                  auVar84._28_4_ = uVar2;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar34,auVar97);
                  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar78,auVar30);
                  uVar2 = puVar27[0xc];
                  auVar58._4_4_ = uVar2;
                  auVar58._0_4_ = uVar2;
                  auVar58._8_4_ = uVar2;
                  auVar58._12_4_ = uVar2;
                  auVar58._16_4_ = uVar2;
                  auVar58._20_4_ = uVar2;
                  auVar58._24_4_ = uVar2;
                  auVar58._28_4_ = uVar2;
                  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar72,auVar33);
                  uVar2 = puVar27[0xd];
                  auVar55._4_4_ = uVar2;
                  auVar55._0_4_ = uVar2;
                  auVar55._8_4_ = uVar2;
                  auVar55._12_4_ = uVar2;
                  auVar55._16_4_ = uVar2;
                  auVar55._20_4_ = uVar2;
                  auVar55._24_4_ = uVar2;
                  auVar55._28_4_ = uVar2;
                  auVar30 = vcvtph2ps_f16c(auVar9);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar64,auVar12);
                  uVar2 = puVar27[0xe];
                  auVar98._4_4_ = uVar2;
                  auVar98._0_4_ = uVar2;
                  auVar98._8_4_ = uVar2;
                  auVar98._12_4_ = uVar2;
                  auVar98._16_4_ = uVar2;
                  auVar98._20_4_ = uVar2;
                  auVar98._24_4_ = uVar2;
                  auVar98._28_4_ = uVar2;
                  auVar33 = vcvtph2ps_f16c(auVar10);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar84,auVar28);
                  uVar2 = puVar27[0xf];
                  auVar52._4_4_ = uVar2;
                  auVar52._0_4_ = uVar2;
                  auVar52._8_4_ = uVar2;
                  auVar52._12_4_ = uVar2;
                  auVar52._16_4_ = uVar2;
                  auVar52._20_4_ = uVar2;
                  auVar52._24_4_ = uVar2;
                  auVar52._28_4_ = uVar2;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar30,auVar102);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar58,auVar29);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar55,auVar34);
                  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar98,auVar30);
                  auVar28._4_4_ = uVar1;
                  auVar28._0_4_ = uVar1;
                  auVar28._8_4_ = uVar1;
                  auVar28._12_4_ = uVar1;
                  auVar28._16_4_ = uVar1;
                  auVar28._20_4_ = uVar1;
                  auVar28._24_4_ = uVar1;
                  auVar28._28_4_ = uVar1;
                  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar33,auVar28);
                  auVar8 = vlddqu_avx(pauVar24[0x18]);
                  auVar9 = vlddqu_avx(pauVar24[0x19]);
                  auVar10 = vlddqu_avx(pauVar24[0x1a]);
                  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar52,auVar33);
                  auVar13 = vlddqu_avx(pauVar24[0x1b]);
                  auVar14 = vlddqu_avx(pauVar24[0x1c]);
                  auVar15 = vlddqu_avx(pauVar24[0x1d]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[0x1e]);
                  auVar11 = vlddqu_avx(pauVar24[0x1f]);
                  uVar1 = puVar27[0x10];
                  auVar105._4_4_ = uVar1;
                  auVar105._0_4_ = uVar1;
                  auVar105._8_4_ = uVar1;
                  auVar105._12_4_ = uVar1;
                  auVar105._16_4_ = uVar1;
                  auVar105._20_4_ = uVar1;
                  auVar105._24_4_ = uVar1;
                  auVar105._28_4_ = uVar1;
                  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar28,auVar78);
                  auVar16 = vfmadd213ps_fma(auVar105,auVar28,ZEXT1632(auVar17));
                  auVar28 = vcvtph2ps_f16c(auVar9);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar28,auVar72);
                  uVar1 = puVar27[0x11];
                  auVar34._4_4_ = uVar1;
                  auVar34._0_4_ = uVar1;
                  auVar34._8_4_ = uVar1;
                  auVar34._12_4_ = uVar1;
                  auVar34._16_4_ = uVar1;
                  auVar34._20_4_ = uVar1;
                  auVar34._24_4_ = uVar1;
                  auVar34._28_4_ = uVar1;
                  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar28,auVar34);
                  auVar28 = vcvtph2ps_f16c(auVar10);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar28,auVar64);
                  uVar1 = puVar27[0x12];
                  auVar35._4_4_ = uVar1;
                  auVar35._0_4_ = uVar1;
                  auVar35._8_4_ = uVar1;
                  auVar35._12_4_ = uVar1;
                  auVar35._16_4_ = uVar1;
                  auVar35._20_4_ = uVar1;
                  auVar35._24_4_ = uVar1;
                  auVar35._28_4_ = uVar1;
                  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar28,auVar35);
                  auVar28 = vcvtph2ps_f16c(auVar13);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar28,auVar84);
                  uVar1 = puVar27[0x13];
                  auVar36._4_4_ = uVar1;
                  auVar36._0_4_ = uVar1;
                  auVar36._8_4_ = uVar1;
                  auVar36._12_4_ = uVar1;
                  auVar36._16_4_ = uVar1;
                  auVar36._20_4_ = uVar1;
                  auVar36._24_4_ = uVar1;
                  auVar36._28_4_ = uVar1;
                  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar28,auVar36);
                  uVar1 = puVar27[0x14];
                  auVar30._4_4_ = uVar1;
                  auVar30._0_4_ = uVar1;
                  auVar30._8_4_ = uVar1;
                  auVar30._12_4_ = uVar1;
                  auVar30._16_4_ = uVar1;
                  auVar30._20_4_ = uVar1;
                  auVar30._24_4_ = uVar1;
                  auVar30._28_4_ = uVar1;
                  auVar28 = vcvtph2ps_f16c(auVar14);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar28,auVar58);
                  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar28,auVar30);
                  auVar28 = vcvtph2ps_f16c(auVar15);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar28,auVar55);
                  uVar1 = puVar27[0x15];
                  auVar37._4_4_ = uVar1;
                  auVar37._0_4_ = uVar1;
                  auVar37._8_4_ = uVar1;
                  auVar37._12_4_ = uVar1;
                  auVar37._16_4_ = uVar1;
                  auVar37._20_4_ = uVar1;
                  auVar37._24_4_ = uVar1;
                  auVar37._28_4_ = uVar1;
                  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar28,auVar37);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar28,auVar98);
                  uVar1 = puVar27[0x16];
                  auVar38._4_4_ = uVar1;
                  auVar38._0_4_ = uVar1;
                  auVar38._8_4_ = uVar1;
                  auVar38._12_4_ = uVar1;
                  auVar38._16_4_ = uVar1;
                  auVar38._20_4_ = uVar1;
                  auVar38._24_4_ = uVar1;
                  auVar38._28_4_ = uVar1;
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar28,auVar38);
                  auVar28 = vcvtph2ps_f16c(auVar11);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar28,auVar52);
                  uVar1 = puVar27[0x17];
                  auVar39._4_4_ = uVar1;
                  auVar39._0_4_ = uVar1;
                  auVar39._8_4_ = uVar1;
                  auVar39._12_4_ = uVar1;
                  auVar39._16_4_ = uVar1;
                  auVar39._20_4_ = uVar1;
                  auVar39._24_4_ = uVar1;
                  auVar39._28_4_ = uVar1;
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar28,auVar39);
                  *pauVar22 = ZEXT1632(auVar8);
                  pauVar22[1] = ZEXT1632(auVar9);
                  puVar26 = puVar26 + 0x10;
                  puVar27 = puVar27 + 0x10;
                  pauVar22 = pauVar22 + 2;
                  iVar21 = iVar21 + 2;
                  uVar20 = uVar5 & 0xfffffffe;
                } while (iVar21 < (int)uVar5);
              }
              iVar21 = uVar5 - uVar20;
              if (iVar21 != 0 && (int)uVar20 <= (int)uVar5) {
                do {
                  uVar1 = *puVar26;
                  auVar45._4_4_ = uVar1;
                  auVar45._0_4_ = uVar1;
                  auVar45._8_4_ = uVar1;
                  auVar45._12_4_ = uVar1;
                  auVar45._16_4_ = uVar1;
                  auVar45._20_4_ = uVar1;
                  auVar45._24_4_ = uVar1;
                  auVar45._28_4_ = uVar1;
                  uVar1 = puVar26[1];
                  auVar48._4_4_ = uVar1;
                  auVar48._0_4_ = uVar1;
                  auVar48._8_4_ = uVar1;
                  auVar48._12_4_ = uVar1;
                  auVar48._16_4_ = uVar1;
                  auVar48._20_4_ = uVar1;
                  auVar48._24_4_ = uVar1;
                  auVar48._28_4_ = uVar1;
                  uVar1 = puVar26[2];
                  auVar53._4_4_ = uVar1;
                  auVar53._0_4_ = uVar1;
                  auVar53._8_4_ = uVar1;
                  auVar53._12_4_ = uVar1;
                  auVar53._16_4_ = uVar1;
                  auVar53._20_4_ = uVar1;
                  auVar53._24_4_ = uVar1;
                  auVar53._28_4_ = uVar1;
                  uVar1 = puVar26[3];
                  auVar56._4_4_ = uVar1;
                  auVar56._0_4_ = uVar1;
                  auVar56._8_4_ = uVar1;
                  auVar56._12_4_ = uVar1;
                  auVar56._16_4_ = uVar1;
                  auVar56._20_4_ = uVar1;
                  auVar56._24_4_ = uVar1;
                  auVar56._28_4_ = uVar1;
                  uVar1 = puVar26[4];
                  auVar59._4_4_ = uVar1;
                  auVar59._0_4_ = uVar1;
                  auVar59._8_4_ = uVar1;
                  auVar59._12_4_ = uVar1;
                  auVar59._16_4_ = uVar1;
                  auVar59._20_4_ = uVar1;
                  auVar59._24_4_ = uVar1;
                  auVar59._28_4_ = uVar1;
                  uVar1 = puVar26[5];
                  auVar65._4_4_ = uVar1;
                  auVar65._0_4_ = uVar1;
                  auVar65._8_4_ = uVar1;
                  auVar65._12_4_ = uVar1;
                  auVar65._16_4_ = uVar1;
                  auVar65._20_4_ = uVar1;
                  auVar65._24_4_ = uVar1;
                  auVar65._28_4_ = uVar1;
                  uVar1 = puVar26[6];
                  auVar40._4_4_ = uVar1;
                  auVar40._0_4_ = uVar1;
                  auVar40._8_4_ = uVar1;
                  auVar40._12_4_ = uVar1;
                  auVar40._16_4_ = uVar1;
                  auVar40._20_4_ = uVar1;
                  auVar40._24_4_ = uVar1;
                  auVar40._28_4_ = uVar1;
                  uVar1 = puVar26[7];
                  auVar31._4_4_ = uVar1;
                  auVar31._0_4_ = uVar1;
                  auVar31._8_4_ = uVar1;
                  auVar31._12_4_ = uVar1;
                  auVar31._16_4_ = uVar1;
                  auVar31._20_4_ = uVar1;
                  auVar31._24_4_ = uVar1;
                  auVar31._28_4_ = uVar1;
                  auVar8 = vlddqu_avx(*pauVar24);
                  auVar9 = vlddqu_avx(pauVar24[1]);
                  auVar10 = vlddqu_avx(pauVar24[2]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[3]);
                  auVar13 = vfmadd213ps_fma(auVar28,auVar45,*pauVar22);
                  auVar28 = vcvtph2ps_f16c(auVar9);
                  auVar30 = vcvtph2ps_f16c(auVar10);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar48,auVar28);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar53,auVar30);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar56,auVar28);
                  auVar8 = vlddqu_avx(pauVar24[4]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar59,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[5]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[6]);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar65,ZEXT1632(auVar9));
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[7]);
                  uVar1 = puVar26[8];
                  auVar60._4_4_ = uVar1;
                  auVar60._0_4_ = uVar1;
                  auVar60._8_4_ = uVar1;
                  auVar60._12_4_ = uVar1;
                  auVar60._16_4_ = uVar1;
                  auVar60._20_4_ = uVar1;
                  auVar60._24_4_ = uVar1;
                  auVar60._28_4_ = uVar1;
                  uVar1 = puVar26[9];
                  auVar66._4_4_ = uVar1;
                  auVar66._0_4_ = uVar1;
                  auVar66._8_4_ = uVar1;
                  auVar66._12_4_ = uVar1;
                  auVar66._16_4_ = uVar1;
                  auVar66._20_4_ = uVar1;
                  auVar66._24_4_ = uVar1;
                  auVar66._28_4_ = uVar1;
                  uVar1 = puVar26[10];
                  auVar73._4_4_ = uVar1;
                  auVar73._0_4_ = uVar1;
                  auVar73._8_4_ = uVar1;
                  auVar73._12_4_ = uVar1;
                  auVar73._16_4_ = uVar1;
                  auVar73._20_4_ = uVar1;
                  auVar73._24_4_ = uVar1;
                  auVar73._28_4_ = uVar1;
                  uVar1 = puVar26[0xb];
                  auVar79._4_4_ = uVar1;
                  auVar79._0_4_ = uVar1;
                  auVar79._8_4_ = uVar1;
                  auVar79._12_4_ = uVar1;
                  auVar79._16_4_ = uVar1;
                  auVar79._20_4_ = uVar1;
                  auVar79._24_4_ = uVar1;
                  auVar79._28_4_ = uVar1;
                  uVar1 = puVar26[0xc];
                  auVar85._4_4_ = uVar1;
                  auVar85._0_4_ = uVar1;
                  auVar85._8_4_ = uVar1;
                  auVar85._12_4_ = uVar1;
                  auVar85._16_4_ = uVar1;
                  auVar85._20_4_ = uVar1;
                  auVar85._24_4_ = uVar1;
                  auVar85._28_4_ = uVar1;
                  uVar1 = puVar26[0xd];
                  auVar89._4_4_ = uVar1;
                  auVar89._0_4_ = uVar1;
                  auVar89._8_4_ = uVar1;
                  auVar89._12_4_ = uVar1;
                  auVar89._16_4_ = uVar1;
                  auVar89._20_4_ = uVar1;
                  auVar89._24_4_ = uVar1;
                  auVar89._28_4_ = uVar1;
                  uVar1 = puVar26[0xe];
                  auVar49._4_4_ = uVar1;
                  auVar49._0_4_ = uVar1;
                  auVar49._8_4_ = uVar1;
                  auVar49._12_4_ = uVar1;
                  auVar49._16_4_ = uVar1;
                  auVar49._20_4_ = uVar1;
                  auVar49._24_4_ = uVar1;
                  auVar49._28_4_ = uVar1;
                  auVar9 = vfmadd213ps_fma(auVar28,auVar40,ZEXT1632(auVar9));
                  uVar1 = puVar26[0xf];
                  auVar41._4_4_ = uVar1;
                  auVar41._0_4_ = uVar1;
                  auVar41._8_4_ = uVar1;
                  auVar41._12_4_ = uVar1;
                  auVar41._16_4_ = uVar1;
                  auVar41._20_4_ = uVar1;
                  auVar41._24_4_ = uVar1;
                  auVar41._28_4_ = uVar1;
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar31,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[8]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar60,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[9]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[10]);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar66,ZEXT1632(auVar9));
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar73,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0xb]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar79,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0xc]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar85,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0xd]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[0xe]);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar89,ZEXT1632(auVar9));
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[0xf]);
                  uVar1 = *puVar27;
                  auVar67._4_4_ = uVar1;
                  auVar67._0_4_ = uVar1;
                  auVar67._8_4_ = uVar1;
                  auVar67._12_4_ = uVar1;
                  auVar67._16_4_ = uVar1;
                  auVar67._20_4_ = uVar1;
                  auVar67._24_4_ = uVar1;
                  auVar67._28_4_ = uVar1;
                  uVar1 = puVar27[1];
                  auVar74._4_4_ = uVar1;
                  auVar74._0_4_ = uVar1;
                  auVar74._8_4_ = uVar1;
                  auVar74._12_4_ = uVar1;
                  auVar74._16_4_ = uVar1;
                  auVar74._20_4_ = uVar1;
                  auVar74._24_4_ = uVar1;
                  auVar74._28_4_ = uVar1;
                  uVar1 = puVar27[2];
                  auVar80._4_4_ = uVar1;
                  auVar80._0_4_ = uVar1;
                  auVar80._8_4_ = uVar1;
                  auVar80._12_4_ = uVar1;
                  auVar80._16_4_ = uVar1;
                  auVar80._20_4_ = uVar1;
                  auVar80._24_4_ = uVar1;
                  auVar80._28_4_ = uVar1;
                  uVar1 = puVar27[3];
                  auVar86._4_4_ = uVar1;
                  auVar86._0_4_ = uVar1;
                  auVar86._8_4_ = uVar1;
                  auVar86._12_4_ = uVar1;
                  auVar86._16_4_ = uVar1;
                  auVar86._20_4_ = uVar1;
                  auVar86._24_4_ = uVar1;
                  auVar86._28_4_ = uVar1;
                  uVar1 = puVar27[4];
                  auVar90._4_4_ = uVar1;
                  auVar90._0_4_ = uVar1;
                  auVar90._8_4_ = uVar1;
                  auVar90._12_4_ = uVar1;
                  auVar90._16_4_ = uVar1;
                  auVar90._20_4_ = uVar1;
                  auVar90._24_4_ = uVar1;
                  auVar90._28_4_ = uVar1;
                  uVar1 = puVar27[5];
                  auVar94._4_4_ = uVar1;
                  auVar94._0_4_ = uVar1;
                  auVar94._8_4_ = uVar1;
                  auVar94._12_4_ = uVar1;
                  auVar94._16_4_ = uVar1;
                  auVar94._20_4_ = uVar1;
                  auVar94._24_4_ = uVar1;
                  auVar94._28_4_ = uVar1;
                  uVar1 = puVar27[6];
                  auVar46._4_4_ = uVar1;
                  auVar46._0_4_ = uVar1;
                  auVar46._8_4_ = uVar1;
                  auVar46._12_4_ = uVar1;
                  auVar46._16_4_ = uVar1;
                  auVar46._20_4_ = uVar1;
                  auVar46._24_4_ = uVar1;
                  auVar46._28_4_ = uVar1;
                  auVar9 = vfmadd213ps_fma(auVar28,auVar49,ZEXT1632(auVar9));
                  uVar1 = puVar27[7];
                  auVar32._4_4_ = uVar1;
                  auVar32._0_4_ = uVar1;
                  auVar32._8_4_ = uVar1;
                  auVar32._12_4_ = uVar1;
                  auVar32._16_4_ = uVar1;
                  auVar32._20_4_ = uVar1;
                  auVar32._24_4_ = uVar1;
                  auVar32._28_4_ = uVar1;
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar41,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x10]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar67,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x11]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[0x12]);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar74,ZEXT1632(auVar9));
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar80,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x13]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar86,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x14]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar90,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x15]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[0x16]);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar94,ZEXT1632(auVar9));
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[0x17]);
                  uVar1 = puVar27[8];
                  auVar68._4_4_ = uVar1;
                  auVar68._0_4_ = uVar1;
                  auVar68._8_4_ = uVar1;
                  auVar68._12_4_ = uVar1;
                  auVar68._16_4_ = uVar1;
                  auVar68._20_4_ = uVar1;
                  auVar68._24_4_ = uVar1;
                  auVar68._28_4_ = uVar1;
                  uVar1 = puVar27[9];
                  auVar75._4_4_ = uVar1;
                  auVar75._0_4_ = uVar1;
                  auVar75._8_4_ = uVar1;
                  auVar75._12_4_ = uVar1;
                  auVar75._16_4_ = uVar1;
                  auVar75._20_4_ = uVar1;
                  auVar75._24_4_ = uVar1;
                  auVar75._28_4_ = uVar1;
                  uVar1 = puVar27[10];
                  auVar81._4_4_ = uVar1;
                  auVar81._0_4_ = uVar1;
                  auVar81._8_4_ = uVar1;
                  auVar81._12_4_ = uVar1;
                  auVar81._16_4_ = uVar1;
                  auVar81._20_4_ = uVar1;
                  auVar81._24_4_ = uVar1;
                  auVar81._28_4_ = uVar1;
                  uVar1 = puVar27[0xb];
                  auVar87._4_4_ = uVar1;
                  auVar87._0_4_ = uVar1;
                  auVar87._8_4_ = uVar1;
                  auVar87._12_4_ = uVar1;
                  auVar87._16_4_ = uVar1;
                  auVar87._20_4_ = uVar1;
                  auVar87._24_4_ = uVar1;
                  auVar87._28_4_ = uVar1;
                  uVar1 = puVar27[0xc];
                  auVar91._4_4_ = uVar1;
                  auVar91._0_4_ = uVar1;
                  auVar91._8_4_ = uVar1;
                  auVar91._12_4_ = uVar1;
                  auVar91._16_4_ = uVar1;
                  auVar91._20_4_ = uVar1;
                  auVar91._24_4_ = uVar1;
                  auVar91._28_4_ = uVar1;
                  uVar1 = puVar27[0xd];
                  auVar95._4_4_ = uVar1;
                  auVar95._0_4_ = uVar1;
                  auVar95._8_4_ = uVar1;
                  auVar95._12_4_ = uVar1;
                  auVar95._16_4_ = uVar1;
                  auVar95._20_4_ = uVar1;
                  auVar95._24_4_ = uVar1;
                  auVar95._28_4_ = uVar1;
                  uVar1 = puVar27[0xe];
                  auVar50._4_4_ = uVar1;
                  auVar50._0_4_ = uVar1;
                  auVar50._8_4_ = uVar1;
                  auVar50._12_4_ = uVar1;
                  auVar50._16_4_ = uVar1;
                  auVar50._20_4_ = uVar1;
                  auVar50._24_4_ = uVar1;
                  auVar50._28_4_ = uVar1;
                  auVar9 = vfmadd213ps_fma(auVar28,auVar46,ZEXT1632(auVar9));
                  uVar1 = puVar27[0xf];
                  auVar42._4_4_ = uVar1;
                  auVar42._0_4_ = uVar1;
                  auVar42._8_4_ = uVar1;
                  auVar42._12_4_ = uVar1;
                  auVar42._16_4_ = uVar1;
                  auVar42._20_4_ = uVar1;
                  auVar42._24_4_ = uVar1;
                  auVar42._28_4_ = uVar1;
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar32,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x18]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar68,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x19]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vlddqu_avx(pauVar24[0x1a]);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar75,ZEXT1632(auVar9));
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar81,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x1b]);
                  puVar26 = puVar26 + 8;
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar87,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x1c]);
                  puVar27 = puVar27 + 8;
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar91,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x1d]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar95,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x1e]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar9 = vfmadd213ps_fma(auVar28,auVar50,ZEXT1632(auVar9));
                  auVar8 = vlddqu_avx(pauVar24[0x1f]);
                  auVar28 = vcvtph2ps_f16c(auVar8);
                  auVar8 = vfmadd213ps_fma(auVar28,auVar42,ZEXT1632(auVar9));
                  *pauVar22 = ZEXT1632(auVar8);
                  pauVar22 = pauVar22 + 1;
                  iVar21 = iVar21 + -1;
                } while (iVar21 != 0);
              }
              puVar26 = puVar26 + 8;
              puVar27 = puVar27 + 8;
              iVar19 = iVar19 + 1;
            } while (iVar19 != iVar6);
          }
          local_208 = local_208 + 1;
        } while (local_208 != uVar4);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != iVar3);
  }
  return;
}

Assistant:

static void conv2x2s1_fp16_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);

            const unsigned short* kptr = (const unsigned short*)kernel.channel(p).row(q);
            // const float* kptr = (const float*)kernel + 4 * inch * p * 64;

            int i = 0;
            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);
                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    __m256 _k00 = loadfp16(kptr);
                    __m256 _k01 = loadfp16(kptr + 8);
                    __m256 _k02 = loadfp16(kptr + 16);
                    __m256 _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    __m256 _k04 = loadfp16(kptr);
                    __m256 _k05 = loadfp16(kptr + 8);
                    __m256 _k06 = loadfp16(kptr + 16);
                    __m256 _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    //========================================

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);

                    _k00 = loadfp16(kptr);
                    _k01 = loadfp16(kptr + 8);
                    _k02 = loadfp16(kptr + 16);
                    _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    _k04 = loadfp16(kptr);
                    _k05 = loadfp16(kptr + 8);
                    _k06 = loadfp16(kptr + 16);
                    _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = loadfp16(kptr);
                    __m256 _k11 = loadfp16(kptr + 8);
                    __m256 _k12 = loadfp16(kptr + 16);
                    __m256 _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    __m256 _k14 = loadfp16(kptr);
                    __m256 _k15 = loadfp16(kptr + 8);
                    __m256 _k16 = loadfp16(kptr + 16);
                    __m256 _k17 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    _k10 = loadfp16(kptr);
                    _k11 = loadfp16(kptr + 8);
                    _k12 = loadfp16(kptr + 16);
                    _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    _k14 = loadfp16(kptr);
                    _k15 = loadfp16(kptr + 8);
                    _k16 = loadfp16(kptr + 16);
                    _k17 = loadfp16(kptr + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum0);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);
                    outptr0 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum = _mm256_loadu_ps(outptr0);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);

                    __m256 _k00 = loadfp16(kptr);
                    __m256 _k01 = loadfp16(kptr + 8);
                    __m256 _k02 = loadfp16(kptr + 16);
                    __m256 _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    __m256 _k04 = loadfp16(kptr);
                    __m256 _k05 = loadfp16(kptr + 8);
                    __m256 _k06 = loadfp16(kptr + 16);
                    __m256 _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);

                    //========================================
                    r0 += 8;
                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _k00 = loadfp16(kptr);
                    _k01 = loadfp16(kptr + 8);
                    _k02 = loadfp16(kptr + 16);
                    _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    _k04 = loadfp16(kptr);
                    _k05 = loadfp16(kptr + 8);
                    _k06 = loadfp16(kptr + 16);
                    _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = loadfp16(kptr);
                    __m256 _k11 = loadfp16(kptr + 8);
                    __m256 _k12 = loadfp16(kptr + 16);
                    __m256 _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    __m256 _k14 = loadfp16(kptr);
                    __m256 _k15 = loadfp16(kptr + 8);
                    __m256 _k16 = loadfp16(kptr + 16);
                    __m256 _k17 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _k10 = loadfp16(kptr);
                    _k11 = loadfp16(kptr + 8);
                    _k12 = loadfp16(kptr + 16);
                    _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    _k14 = loadfp16(kptr);
                    _k15 = loadfp16(kptr + 8);
                    _k16 = loadfp16(kptr + 16);
                    _k17 = loadfp16(kptr + 24);
                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum);
                    outptr0 += 8;
                }

                r0 += 8;
                r1 += 8;
            }
        }
    }
}